

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

OnCallSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
* __thiscall
testing::internal::
OnCallSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
::WillByDefault(OnCallSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                *this,Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                      *action)

{
  Clause CVar1;
  _Manager_type p_Var2;
  allocator local_41;
  string local_40;
  
  CVar1 = (this->super_UntypedOnCallSpecBase).last_clause_;
  std::__cxx11::string::string
            ((string *)&local_40,".WillByDefault() must appear exactly once in an ON_CALL().",
             &local_41);
  UntypedOnCallSpecBase::ExpectSpecProperty
            (&this->super_UntypedOnCallSpecBase,(int)CVar1 < 2,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_UntypedOnCallSpecBase).last_clause_ = kWillByDefault;
  p_Var2 = (action->fun_).super__Function_base._M_manager;
  std::__cxx11::string::string
            ((string *)&local_40,"DoDefault() cannot be used in ON_CALL().",&local_41);
  UntypedOnCallSpecBase::ExpectSpecProperty
            (&this->super_UntypedOnCallSpecBase,p_Var2 != (_Manager_type)0x0,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::
  function<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  ::operator=(&(this->action_).fun_,&action->fun_);
  return this;
}

Assistant:

OnCallSpec& WillByDefault(const Action<F>& action) {
    ExpectSpecProperty(last_clause_ < kWillByDefault,
                       ".WillByDefault() must appear "
                       "exactly once in an ON_CALL().");
    last_clause_ = kWillByDefault;

    ExpectSpecProperty(!action.IsDoDefault(),
                       "DoDefault() cannot be used in ON_CALL().");
    action_ = action;
    return *this;
  }